

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O3

void __thiscall leveldb::TableBuilder::Rep::~Rep(Rep *this)

{
  pointer pcVar1;
  pointer puVar2;
  char *pcVar3;
  
  pcVar1 = (this->compressed_output)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->compressed_output).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->last_key)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->last_key).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->index_block).last_key_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->index_block).last_key_.field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->index_block).restarts_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pcVar1 = (this->index_block).buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->index_block).buffer_.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->data_block).last_key_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->data_block).last_key_.field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->data_block).restarts_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pcVar1 = (this->data_block).buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->data_block).buffer_.field_2) {
    operator_delete(pcVar1);
  }
  pcVar3 = (this->status).state_;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
    return;
  }
  return;
}

Assistant:

Rep(const Options& opt, WritableFile* f)
      : options(opt),
        index_block_options(opt),
        file(f),
        offset(0),
        data_block(&options),
        index_block(&index_block_options),
        num_entries(0),
        closed(false),
        filter_block(opt.filter_policy == nullptr
                         ? nullptr
                         : new FilterBlockBuilder(opt.filter_policy)),
        pending_index_entry(false) {
    index_block_options.block_restart_interval = 1;
  }